

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwriter_buffer.c
# Opt level: O1

void aom_wb_write_signed_primitive_refsubexpfin
               (aom_write_bit_buffer *wb,uint16_t n,uint16_t k,int16_t ref,int16_t v)

{
  uint uVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int i;
  int iVar12;
  undefined4 local_40;
  
  uVar5 = (n - 1) + ref;
  uVar6 = (n - 1) + v;
  uVar9 = (uint)(ushort)(n * 2 - 1);
  if (uVar9 < (uint)uVar5 * 2) {
    sVar3 = n * 2 + -2;
    uVar5 = sVar3 - uVar5;
    uVar6 = sVar3 - uVar6;
    if ((uint)uVar5 * 2 < (uint)uVar6) goto LAB_0025f983;
    if (uVar6 < uVar5) {
      uVar6 = (uVar5 - uVar6) * 2 - 1;
      goto LAB_0025f983;
    }
    sVar3 = uVar6 - uVar5;
  }
  else {
    if ((uint)uVar5 * 2 < (uint)uVar6) goto LAB_0025f983;
    if (uVar6 < uVar5) {
      uVar6 = (uVar5 - uVar6) * 2 - 1;
      goto LAB_0025f983;
    }
    sVar3 = uVar6 - uVar5;
  }
  uVar6 = sVar3 * 2;
LAB_0025f983:
  uVar4 = (uint)uVar6;
  iVar8 = 0;
  iVar12 = 0;
  do {
    local_40 = (uint)k;
    uVar1 = (k - 1) + iVar12;
    if (iVar12 == 0) {
      uVar1 = local_40;
    }
    if ((3 << ((byte)uVar1 & 0x1f)) + iVar8 < (int)uVar9) {
      iVar10 = (1 << ((byte)uVar1 & 0x1f)) + iVar8;
      aom_wb_write_bit(wb,(uint)(iVar10 <= (int)uVar4));
      if ((int)uVar4 < iVar10) {
        if (0 < (int)uVar1) {
          iVar10 = iVar12 + (uint)(iVar12 == 0) + local_40;
          do {
            aom_wb_write_bit(wb,(uint)((uVar4 - iVar8 >> (iVar10 - 2U & 0x1f) & 1) != 0));
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        bVar2 = false;
      }
      else {
        iVar12 = iVar12 + 1;
        bVar2 = true;
        iVar8 = iVar10;
      }
    }
    else if ((ushort)(uVar9 - iVar8) < 2) {
      bVar2 = false;
    }
    else {
      uVar7 = uVar9 - iVar8 & 0xffff;
      uVar1 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      iVar10 = (2 << ((byte)uVar1 & 0x1f)) - uVar7;
      uVar7 = uVar4 - iVar8 & 0xffff;
      if ((int)uVar7 < iVar10) {
        if ((uVar1 ^ 0x1f) == 0x1f) {
          bVar2 = false;
          goto LAB_0025fb1b;
        }
        iVar10 = uVar1 + 1;
        do {
          aom_wb_write_bit(wb,(uint)((uVar7 >> (iVar10 - 2U & 0x1f) & 1) != 0));
          iVar10 = iVar10 + -1;
        } while (1 < iVar10);
      }
      else {
        if ((uVar1 ^ 0x1f) != 0x1f) {
          iVar11 = uVar1 + 1;
          do {
            aom_wb_write_bit(wb,(uint)(((uint)(((int)(uVar7 - iVar10) >> 1) + iVar10) >>
                                        (iVar11 - 2U & 0x1f) & 1) != 0));
            iVar11 = iVar11 + -1;
          } while (1 < iVar11);
        }
        aom_wb_write_bit(wb,uVar7 - iVar10 & 1);
      }
      bVar2 = false;
    }
LAB_0025fb1b:
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void aom_wb_write_signed_primitive_refsubexpfin(struct aom_write_bit_buffer *wb,
                                                uint16_t n, uint16_t k,
                                                int16_t ref, int16_t v) {
  ref += n - 1;
  v += n - 1;
  const uint16_t scaled_n = (n << 1) - 1;
  wb_write_primitive_refsubexpfin(wb, scaled_n, k, ref, v);
}